

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O1

TCGTemp * tcg_temp_new_internal_mips(TCGContext_conflict3 *s,TCGType_conflict type,_Bool temp_local)

{
  unsigned_long *puVar1;
  ulong uVar2;
  long lVar3;
  byte bVar4;
  TCGTemp *pTVar5;
  int iVar6;
  TCGTempSet *pTVar7;
  undefined7 in_register_00000011;
  ulong uVar8;
  bool bVar9;
  
  pTVar7 = s->free_temps + (int)((int)CONCAT71(in_register_00000011,temp_local) * 5 + type);
  uVar8 = 0;
  do {
    uVar2 = pTVar7->l[0];
    if (uVar2 != 0) {
      lVar3 = 0;
      if (uVar2 != 0) {
        for (; (uVar2 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
        }
      }
      iVar6 = (int)lVar3 + (int)uVar8;
      goto LAB_007299cf;
    }
    pTVar7 = (TCGTempSet *)(pTVar7->l + 1);
    bVar9 = uVar8 < 0x1c0;
    uVar8 = uVar8 + 0x40;
  } while (bVar9);
  iVar6 = 0x200;
LAB_007299cf:
  if (iVar6 < 0x200) {
    bVar4 = (byte)iVar6 & 0x3f;
    puVar1 = s->free_temps[(int)((int)CONCAT71(in_register_00000011,temp_local) * 5 + type)].l +
             ((ulong)(long)iVar6 >> 6);
    *puVar1 = *puVar1 & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
    pTVar5 = s->temps + iVar6;
    *(ulong *)pTVar5 = *(ulong *)pTVar5 | 0x8000000000;
    return pTVar5;
  }
  iVar6 = s->nb_temps;
  s->nb_temps = iVar6 + 1;
  pTVar5 = s->temps + iVar6;
  *(undefined8 *)pTVar5 = 0;
  s->temps[iVar6].val = 0;
  s->temps[iVar6].name = (char *)0x0;
  s->temps[iVar6].state = 0;
  s->temps[iVar6].mem_base = (TCGTemp *)0x0;
  s->temps[iVar6].mem_offset = 0;
  uVar8 = 0;
  if (temp_local) {
    uVar8 = 0x4000000000;
  }
  s->temps[iVar6].state_ptr = (void *)0x0;
  *(ulong *)pTVar5 = uVar8 | 0x8000000000 | (ulong)((type & 0xff) * 0x1010000);
  return pTVar5;
}

Assistant:

TCGTemp *tcg_temp_new_internal(TCGContext *s, TCGType type, bool temp_local)
{
    TCGTemp *ts;
    int idx, k;

    k = type + (temp_local ? TCG_TYPE_COUNT : 0);
    idx = find_first_bit(s->free_temps[k].l, TCG_MAX_TEMPS);
    if (idx < TCG_MAX_TEMPS) {
        /* There is already an available temp with the right type.  */
        clear_bit(idx, s->free_temps[k].l);

        ts = &s->temps[idx];
        ts->temp_allocated = 1;
        tcg_debug_assert(ts->base_type == type);
        tcg_debug_assert(ts->temp_local == temp_local);
    } else {
        ts = tcg_temp_alloc(s);
        if (TCG_TARGET_REG_BITS == 32 && type == TCG_TYPE_I64) {
            TCGTemp *ts2 = tcg_temp_alloc(s);

            ts->base_type = type;
            ts->type = TCG_TYPE_I32;
            ts->temp_allocated = 1;
            ts->temp_local = temp_local;

            tcg_debug_assert(ts2 == ts + 1);
            ts2->base_type = TCG_TYPE_I64;
            ts2->type = TCG_TYPE_I32;
            ts2->temp_allocated = 1;
            ts2->temp_local = temp_local;
        } else {
            ts->base_type = type;
            ts->type = type;
            ts->temp_allocated = 1;
            ts->temp_local = temp_local;
        }
    }

#if defined(CONFIG_DEBUG_TCG)
    s->temps_in_use++;
#endif
    return ts;
}